

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O1

void __thiscall CTB<UFPC>::PerformLabeling(CTB<UFPC> *this)

{
  char cVar1;
  int iVar2;
  int *piVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint uVar6;
  long lVar7;
  uint *puVar8;
  long lVar9;
  undefined4 uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  bool bVar25;
  long local_c8;
  long local_c0;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar3 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar3,piVar3[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  UFPC::P_ = (uint *)operator_new__((ulong)(((*(int *)&pMVar4->field_0xc -
                                             (*(int *)&pMVar4->field_0xc + 1 >> 0x1f)) + 1 >> 1) *
                                            ((*(int *)&pMVar4->field_0x8 -
                                             (*(int *)&pMVar4->field_0x8 + 1 >> 0x1f)) + 1 >> 1) + 1
                                           ) << 2);
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  iVar2 = *(int *)&pMVar4->field_0x8;
  uVar14 = (ulong)iVar2;
  if (0 < (long)uVar14) {
    uVar6 = *(uint *)&pMVar4->field_0xc;
    lVar7 = (long)(int)uVar6;
    local_c0 = -1;
    local_c8 = 1;
    uVar17 = 0;
    do {
      if (0 < (int)uVar6) {
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar18 = *(long *)&pMVar5->field_0x10;
        lVar16 = **(long **)&pMVar5->field_0x48;
        lVar21 = lVar16 * uVar17 + lVar18;
        lVar9 = *(long *)&pMVar4->field_0x10;
        lVar13 = **(long **)&pMVar4->field_0x48;
        uVar11 = uVar17 | 1;
        lVar23 = lVar16 * local_c0 + lVar18;
        lVar24 = lVar13 * local_c0 + lVar9;
        lVar18 = lVar16 * local_c8 + lVar18;
        lVar12 = lVar13 * local_c8 + lVar9;
        lVar9 = lVar13 * uVar17 + lVar9;
        uVar10 = 0xffffffff;
        lVar13 = -4;
        lVar19 = 0;
        iVar22 = -1;
        uVar20 = 1;
        do {
          switch(uVar10) {
          case 1:
            if (*(char *)(lVar9 + -1 + uVar20) != '\0') {
              if (uVar17 == 0) {
LAB_001a5557:
                if ((uVar20 == 1 || uVar17 == 0) || (*(char *)(lVar24 + -2 + uVar20) == '\0')) {
                  UFPC::P_[UFPC::length_] = UFPC::length_;
                  uVar15 = UFPC::length_ + 1;
                  *(uint *)(lVar21 + -4 + uVar20 * 4) = UFPC::length_;
                  UFPC::length_ = uVar15;
                }
                else {
                  *(undefined4 *)(lVar21 + -4 + uVar20 * 4) =
                       *(undefined4 *)(lVar23 + -8 + uVar20 * 4);
                }
                iVar22 = 6;
              }
              else if (*(char *)(lVar24 + -1 + uVar20) == '\0') {
                if ((lVar7 <= (long)uVar20) || (*(char *)(lVar24 + uVar20) == '\0'))
                goto LAB_001a5557;
                uVar15 = *(uint *)(lVar23 + uVar20 * 4);
                *(uint *)(lVar21 + -4 + uVar20 * 4) = uVar15;
                iVar22 = 5;
                if ((uVar20 != 1) && (*(char *)(lVar24 + -2 + uVar20) != '\0')) {
                  UFPC::Merge(uVar15,*(uint *)(lVar23 + -8 + uVar20 * 4));
                }
              }
              else {
                *(undefined4 *)(lVar21 + -4 + uVar20 * 4) =
                     *(undefined4 *)(lVar23 + -4 + uVar20 * 4);
                iVar22 = 4;
              }
              uVar10 = 2;
              goto LAB_001a55b8;
            }
            uVar10 = 1;
            if ((uVar11 < uVar14) && (*(char *)(lVar12 + -1 + uVar20) != '\0')) {
              UFPC::P_[UFPC::length_] = UFPC::length_;
              uVar15 = UFPC::length_ + 1;
              *(uint *)(lVar18 + -4 + uVar20 * 4) = UFPC::length_;
              UFPC::length_ = uVar15;
              uVar10 = 3;
            }
            break;
          case 2:
            if (*(char *)(lVar9 + -1 + uVar20) == '\0') goto LAB_001a51aa;
            uVar10 = 2;
LAB_001a5112:
            if (iVar22 == 6) {
LAB_001a51dd:
              uVar15 = *(uint *)(lVar21 + -8 + uVar20 * 4);
              *(uint *)(lVar21 + -4 + uVar20 * 4) = uVar15;
              iVar22 = 6;
              if (uVar17 != 0) {
LAB_001a51f6:
                iVar22 = 6;
                if (((long)uVar20 < lVar7) && (*(char *)(lVar24 + uVar20) != '\0'))
                goto LAB_001a53d4;
              }
            }
            else if (iVar22 == 5) {
LAB_001a5190:
              *(undefined4 *)(lVar21 + -4 + uVar20 * 4) = *(undefined4 *)(lVar21 + -8 + uVar20 * 4);
              iVar22 = 5;
              uVar10 = 5;
            }
            else if (iVar22 == 4) {
              uVar15 = *(uint *)(lVar21 + -8 + uVar20 * 4);
              *(uint *)(lVar21 + -4 + uVar20 * 4) = uVar15;
              goto LAB_001a513b;
            }
LAB_001a55b8:
            if (uVar11 < uVar14) {
              cVar1 = *(char *)(lVar12 + -1 + uVar20);
joined_r0x001a52fd:
              if (cVar1 != '\0') goto LAB_001a55ca;
            }
            break;
          case 3:
          case 7:
          case 9:
            if (*(char *)(lVar9 + -1 + uVar20) == '\0') {
              uVar10 = 1;
              if ((uVar11 < uVar14) && (*(char *)(lVar12 + -1 + uVar20) != '\0')) {
                *(undefined4 *)(lVar18 + -4 + uVar20 * 4) =
                     *(undefined4 *)(lVar18 + -8 + uVar20 * 4);
                uVar10 = 9;
              }
            }
            else {
              if (uVar17 == 0) {
LAB_001a5281:
                uVar15 = *(uint *)(lVar18 + -8 + uVar20 * 4);
                *(uint *)(lVar21 + -4 + uVar20 * 4) = uVar15;
                iVar22 = 6;
                if ((uVar20 != 1 && uVar17 != 0) && (*(char *)(lVar24 + -2 + uVar20) != '\0')) {
LAB_001a52b4:
                  puVar8 = (uint *)((lVar21 - lVar16) + (lVar19 + -1) * 4);
LAB_001a52bd:
                  UFPC::Merge(uVar15,*puVar8);
                }
              }
              else {
                if (*(char *)(lVar24 + -1 + uVar20) != '\0') {
                  uVar15 = *(uint *)(lVar23 + -4 + uVar20 * 4);
                  *(uint *)(lVar21 + -4 + uVar20 * 4) = uVar15;
                  puVar8 = (uint *)(lVar18 + lVar13);
                  iVar22 = 4;
                  goto LAB_001a52bd;
                }
                if ((lVar7 <= (long)uVar20) || (*(char *)(lVar24 + uVar20) == '\0'))
                goto LAB_001a5281;
                uVar15 = *(uint *)(lVar23 + uVar20 * 4);
                *(uint *)(lVar21 + -4 + uVar20 * 4) = uVar15;
                UFPC::Merge(uVar15,*(uint *)(lVar18 + -8 + uVar20 * 4));
                iVar22 = 5;
                if ((uVar20 != 1) && (*(char *)(lVar24 + -2 + uVar20) != '\0')) {
                  uVar15 = *(uint *)(lVar21 + -4 + uVar20 * 4);
                  goto LAB_001a52b4;
                }
              }
              uVar10 = 8;
              if (uVar11 < uVar14) {
                cVar1 = *(char *)(lVar12 + -1 + uVar20);
                goto joined_r0x001a52fd;
              }
            }
            break;
          case 4:
            if (*(char *)(lVar9 + -1 + uVar20) != '\0') {
              uVar10 = 4;
              if (iVar22 == 6) goto LAB_001a51dd;
              if (iVar22 == 5) goto LAB_001a5190;
              if (iVar22 != 4) goto LAB_001a55b8;
              uVar15 = *(uint *)(lVar21 + -8 + uVar20 * 4);
              *(uint *)(lVar21 + -4 + uVar20 * 4) = uVar15;
LAB_001a513b:
              uVar10 = 4;
              iVar22 = 6;
              if (uVar17 != 0) {
                bVar25 = *(char *)(lVar24 + -1 + uVar20) == '\0';
                if (bVar25) goto LAB_001a51f6;
                iVar22 = (uint)bVar25 * 2 + 4;
              }
              goto LAB_001a55b8;
            }
            goto LAB_001a51aa;
          case 5:
            if (*(char *)(lVar9 + -1 + uVar20) != '\0') {
              uVar15 = *(uint *)(lVar21 + -8 + uVar20 * 4);
              *(uint *)(lVar21 + -4 + uVar20 * 4) = uVar15;
              iVar22 = 6;
              if (uVar17 != 0) {
                bVar25 = *(char *)(lVar24 + -1 + uVar20) == '\0';
                if (bVar25) {
                  if (((long)uVar20 < lVar7) && (*(char *)(lVar24 + uVar20) != '\0')) {
                    UFPC::Merge(uVar15,*(uint *)(lVar23 + uVar20 * 4));
                    iVar22 = 5;
                  }
                }
                else {
                  iVar22 = (uint)bVar25 * 2 + 4;
                }
              }
              uVar10 = 4;
              goto LAB_001a55b8;
            }
            goto LAB_001a51aa;
          case 6:
            if (*(char *)(lVar9 + -1 + uVar20) != '\0') {
              if (iVar22 == 6) {
                uVar15 = *(uint *)(lVar21 + -8 + uVar20 * 4);
                *(uint *)(lVar21 + -4 + uVar20 * 4) = uVar15;
                uVar10 = 6;
                if (((uVar17 == 0) || (lVar7 <= (long)uVar20)) ||
                   (*(char *)(lVar24 + uVar20) == '\0')) {
                  iVar22 = 6;
                }
                else {
LAB_001a53d4:
                  UFPC::Merge(uVar15,*(uint *)(lVar23 + uVar20 * 4));
                  iVar22 = 5;
                }
              }
              else {
                uVar10 = 6;
                if (iVar22 == 5) goto LAB_001a5190;
              }
              goto LAB_001a55b8;
            }
            goto LAB_001a51aa;
          case 8:
            if (*(char *)(lVar9 + -1 + uVar20) != '\0') {
              uVar10 = 8;
              goto LAB_001a5112;
            }
LAB_001a51aa:
            uVar10 = 1;
            if ((uVar11 < uVar14) && (*(char *)(lVar12 + -1 + uVar20) != '\0')) {
              *(undefined4 *)(lVar18 + -4 + uVar20 * 4) = *(undefined4 *)(lVar21 + -8 + uVar20 * 4);
LAB_001a51d3:
              uVar10 = 7;
            }
            break;
          case 0xffffffff:
            if (*(char *)(lVar9 + -1 + uVar20) != '\0') {
              if (uVar17 == 0) {
LAB_001a543c:
                UFPC::P_[UFPC::length_] = UFPC::length_;
                iVar22 = 6;
                uVar15 = UFPC::length_;
                UFPC::length_ = UFPC::length_ + 1;
              }
              else if (*(char *)(lVar24 + -1 + uVar20) == '\0') {
                if ((lVar7 <= (long)uVar20) || (*(char *)(lVar24 + uVar20) == '\0'))
                goto LAB_001a543c;
                iVar22 = 5;
                uVar15 = *(uint *)(lVar23 + uVar20 * 4);
              }
              else {
                iVar22 = 4;
                uVar15 = *(uint *)(lVar23 + -4 + uVar20 * 4);
              }
              *(uint *)(lVar21 + -4 + uVar20 * 4) = uVar15;
              uVar10 = 2;
              if ((uVar14 <= uVar11) || (*(char *)(lVar12 + -1 + uVar20) == '\0')) break;
LAB_001a55ca:
              *(undefined4 *)(lVar18 + -4 + uVar20 * 4) = *(undefined4 *)(lVar21 + -4 + uVar20 * 4);
              break;
            }
            uVar10 = 1;
            if ((uVar14 <= uVar11) || (*(char *)(lVar12 + -1 + uVar20) == '\0')) break;
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar15 = UFPC::length_ + 1;
            *(uint *)(lVar18 + -4 + uVar20 * 4) = UFPC::length_;
            UFPC::length_ = uVar15;
            goto LAB_001a51d3;
          }
          lVar19 = lVar19 + 1;
          lVar13 = lVar13 + 4;
          bVar25 = uVar20 != uVar6;
          uVar20 = uVar20 + 1;
        } while (bVar25);
      }
      uVar17 = uVar17 + 2;
      local_c0 = local_c0 + 2;
      local_c8 = local_c8 + 2;
    } while ((int)uVar17 < iVar2);
  }
  puVar8 = UFPC::P_;
  uVar6 = 1;
  if (1 < UFPC::length_) {
    uVar6 = 1;
    uVar14 = 1;
    do {
      if (puVar8[uVar14] < uVar14) {
        puVar8[uVar14] = puVar8[puVar8[uVar14]];
      }
      else {
        puVar8[uVar14] = uVar6;
        uVar6 = uVar6 + 1;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < UFPC::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar6;
  puVar8 = UFPC::P_;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  if (0 < *(int *)&pMVar5->field_0x8) {
    lVar7 = *(long *)&pMVar5->field_0x10;
    lVar18 = **(long **)&pMVar5->field_0x48;
    lVar16 = 0;
    do {
      iVar2 = *(int *)&pMVar5->field_0xc;
      if ((long)iVar2 != 0) {
        lVar9 = 0;
        do {
          *(uint *)(lVar7 + lVar9) = puVar8[*(uint *)(lVar7 + lVar9)];
          lVar9 = lVar9 + 4;
        } while ((long)iVar2 * 4 != lVar9);
      }
      lVar16 = lVar16 + 1;
      lVar7 = lVar7 + lVar18;
    } while (lVar16 < *(int *)&pMVar5->field_0x8);
  }
  if (UFPC::P_ != (uint *)0x0) {
    operator_delete__(UFPC::P_);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Scan Mask
        // +--+--+--+
        // |n1|n2|n3|
        // +--+--+--+
        // |n4|a |
        // +--+--+
        // |n5|b |
        // +--+--+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);
            unsigned int* const img_labels_row_fol = (unsigned int *)(((char *)img_labels_row) + img_labels_.step.p[0]);

            int prob_fol_state = BR;
            int prev_state = BR;

            for (int c = 0; c < w; c += 1) {

                // A bunch of defines used to check if the pixels are foreground, and current state of graph
                // without going outside the image limits.

#define CONDITION_A img_row[c]>0
#define CONDITION_B r+1<h && img_row_fol[c]>0
#define CONDITION_N1 c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_N2 r-1>=0 && img_row_prev[c]>0
#define CONDITION_N3 r-1>=0 && c+1<w && img_row_prev[c+1]>0
#define CONDITION_N4 c-1>=0 && img_row[c-1]>0
#define CONDITION_N5 c-1>=0 && r+1<h && img_row_fol[c-1]>0

#define ACTION_1 // nothing
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // a <- n1
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // a <- n2
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // a <- n3
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // a <- n4
#define ACTION_7 img_labels_row[c] = img_labels_row_fol[c - 1]; // a <- n5
#define ACTION_8 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c - 1]); // a + n1
#define ACTION_9 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c + 1]); // a + n3
#define ACTION_10 LabelsSolver::Merge(img_labels_row[c], img_labels_row_fol[c - 1]); // a + n5
#define ACTION_11 img_labels_row_fol[c] = LabelsSolver::NewLabel(); // b new label
#define ACTION_12 img_labels_row_fol[c] = img_labels_row[c - 1]; // b <- n4
#define ACTION_13 img_labels_row_fol[c] = img_labels_row_fol[c - 1]; // b <- n5
#define ACTION_14 img_labels_row_fol[c] = img_labels_row[c]; // b <- a

#include "labeling_he_2014_graph.inc.h"
            }//End columns's for
        }//End rows's for

#undef ACTION_1 
#undef ACTION_2 
#undef ACTION_3 
#undef ACTION_4 
#undef ACTION_5 
#undef ACTION_6 
#undef ACTION_7 
#undef ACTION_8 
#undef ACTION_9 
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14

#undef CONDITION_A 
#undef CONDITION_B 
#undef CONDITION_N1
#undef CONDITION_N2
#undef CONDITION_N3
#undef CONDITION_N4
#undef CONDITION_N5

        n_labels_ = LabelsSolver::Flatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *img_labels_row_start = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *img_labels_row_end = img_labels_row_start + img_labels_.cols;
            unsigned int *img_labels_row = img_labels_row_start;
            for (int c_i = 0; img_labels_row != img_labels_row_end; ++img_labels_row, ++c_i) {
                *img_labels_row = LabelsSolver::GetLabel(*img_labels_row);
            }
        }

        LabelsSolver::Dealloc();
    }